

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SessionID.h
# Opt level: O2

void __thiscall
FIX::SessionID::SessionID
          (SessionID *this,string *beginString,string *senderCompID,string *targetCompID,
          string *sessionQualifier)

{
  bool bVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  BeginString::BeginString(&this->m_beginString,beginString);
  SenderCompID::SenderCompID(&this->m_senderCompID,senderCompID);
  TargetCompID::TargetCompID(&this->m_targetCompID,targetCompID);
  std::__cxx11::string::string((string *)&this->m_sessionQualifier,(string *)sessionQualifier);
  this->m_isFIXT = false;
  (this->m_frozenString)._M_dataplus._M_p = (pointer)&(this->m_frozenString).field_2;
  (this->m_frozenString)._M_string_length = 0;
  (this->m_frozenString).field_2._M_local_buf[0] = '\0';
  toString(this,&this->m_frozenString);
  std::__cxx11::string::substr((ulong)&local_50,(ulong)beginString);
  bVar1 = std::operator==(&local_50,"FIXT");
  std::__cxx11::string::~string((string *)&local_50);
  if (bVar1) {
    this->m_isFIXT = true;
  }
  return;
}

Assistant:

SessionID( const std::string& beginString,
             const std::string& senderCompID,
             const std::string& targetCompID,
             const std::string& sessionQualifier = "" )
  : m_beginString( BeginString(beginString) ),
    m_senderCompID( SenderCompID(senderCompID) ),
    m_targetCompID( TargetCompID(targetCompID) ),
    m_sessionQualifier( sessionQualifier ),
    m_isFIXT(false)
  {
    toString(m_frozenString);
    if( beginString.substr(0, 4) == "FIXT" )
      m_isFIXT = true;
  }